

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

void __thiscall Gluco::Solver::reset(Solver *this)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  
  this->ok = true;
  this->K = opt_K.value;
  this->R = opt_R.value;
  this->firstReduceDB = opt_first_reduce_db.value;
  this->var_decay = opt_var_decay.value;
  this->solves = 0;
  this->starts = 0;
  this->decisions = 0;
  this->propagations = 0;
  this->conflicts = 0;
  this->conflictsRestarts = 0;
  this->curRestart = 1;
  this->var_inc = 1.0;
  this->cla_inc = 1.0;
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::clear
            (&this->watches,false);
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::clear
            (&this->watchesBin,false);
  this->qhead = 0;
  this->simpDB_assigns = -1;
  this->simpDB_props = 0;
  piVar1 = (this->order_heap).heap.data;
  if ((this->order_heap).heap.sz < 1) {
    if (piVar1 == (int *)0x0) goto LAB_005ca93e;
  }
  else {
    piVar2 = (this->order_heap).indices.data;
    lVar3 = 0;
    do {
      piVar2[piVar1[lVar3]] = -1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->order_heap).heap.sz);
  }
  (this->order_heap).heap.sz = 0;
LAB_005ca93e:
  this->progress_estimate = 0.0;
  *(undefined4 *)&this->conflict_budget = 0xffffffff;
  *(undefined4 *)((long)&this->conflict_budget + 4) = 0xffffffff;
  *(undefined4 *)&this->propagation_budget = 0xffffffff;
  *(undefined4 *)((long)&this->propagation_budget + 4) = 0xffffffff;
  this->nbVarsInitialFormula = 0x7fffffff;
  this->MYFLAG = 0;
  this->totalTime4Sat = 0.0;
  this->totalTime4Unsat = 0.0;
  this->nbSatCalls = 0;
  this->nbUnsatCalls = 0;
  if ((this->lbdQueue).elems.data != (uint *)0x0) {
    (this->lbdQueue).elems.sz = 0;
  }
  (this->lbdQueue).first = 0;
  (this->lbdQueue).sumofqueue = 0;
  (this->lbdQueue).maxsize = 0;
  (this->lbdQueue).queuesize = 0;
  bqueue<unsigned_int>::initSize(&this->lbdQueue,(int)this->sizeLBDQueue);
  if ((this->trailQueue).elems.data != (uint *)0x0) {
    (this->trailQueue).elems.sz = 0;
  }
  (this->trailQueue).first = 0;
  (this->trailQueue).sumofqueue = 0;
  (this->trailQueue).maxsize = 0;
  (this->trailQueue).queuesize = 0;
  bqueue<unsigned_int>::initSize(&this->trailQueue,(int)this->sizeTrailQueue);
  this->sumLBD = 0.0;
  this->nbclausesbeforereduce = this->firstReduceDB;
  if ((this->clauses).data != (uint *)0x0) {
    (this->clauses).sz = 0;
  }
  if ((this->learnts).data != (uint *)0x0) {
    (this->learnts).sz = 0;
  }
  if ((this->model).data != (lbool *)0x0) {
    (this->model).sz = 0;
  }
  if ((this->conflict).data != (Lit *)0x0) {
    (this->conflict).sz = 0;
  }
  if ((this->activity).data != (double *)0x0) {
    (this->activity).sz = 0;
  }
  if ((this->assigns).data != (lbool *)0x0) {
    (this->assigns).sz = 0;
  }
  if ((this->polarity).data != (char *)0x0) {
    (this->polarity).sz = 0;
  }
  if ((this->decision).data != (char *)0x0) {
    (this->decision).sz = 0;
  }
  if ((this->trail).data != (Lit *)0x0) {
    (this->trail).sz = 0;
  }
  if ((this->nbpos).data != (int *)0x0) {
    (this->nbpos).sz = 0;
  }
  if ((this->trail_lim).data != (int *)0x0) {
    (this->trail_lim).sz = 0;
  }
  if ((this->vardata).data != (VarData *)0x0) {
    (this->vardata).sz = 0;
  }
  if ((this->assumptions).data != (Lit *)0x0) {
    (this->assumptions).sz = 0;
  }
  if ((this->permDiff).data != (uint *)0x0) {
    (this->permDiff).sz = 0;
  }
  if ((this->lastDecisionLevel).data != (Lit *)0x0) {
    (this->lastDecisionLevel).sz = 0;
  }
  (this->ca).super_RegionAllocator<unsigned_int>.sz = 0;
  (this->ca).super_RegionAllocator<unsigned_int>.wasted_ = 0;
  if ((this->seen).data != (char *)0x0) {
    (this->seen).sz = 0;
  }
  if ((this->analyze_stack).data != (Lit *)0x0) {
    (this->analyze_stack).sz = 0;
  }
  if ((this->analyze_toclear).data != (Lit *)0x0) {
    (this->analyze_toclear).sz = 0;
  }
  if ((this->add_tmp).data != (Lit *)0x0) {
    (this->add_tmp).sz = 0;
  }
  if ((this->assumptionPositions).data != (int *)0x0) {
    (this->assumptionPositions).sz = 0;
  }
  if ((this->initialPositions).data != (int *)0x0) {
    (this->initialPositions).sz = 0;
  }
  return;
}

Assistant:

void Solver::reset() 
{
    // Reset everything
    ok = true;
    K = (double)opt_K;
    R = (double)opt_R;
    firstReduceDB = opt_first_reduce_db;
    var_decay = (double)opt_var_decay;
    //max_var_decay = opt_max_var_decay;
    solves = starts = decisions = propagations = conflicts = conflictsRestarts = 0;
    curRestart = 1;
    cla_inc = var_inc = 1;
    watches.clear(false); // We don't free the memory, new calls should be of the same size order.
    watchesBin.clear(false); 
    //unaryWatches.clear(false);
    qhead = 0;
    simpDB_assigns = -1;
    simpDB_props = 0;
    order_heap.clear(false);
    progress_estimate = 0;
    //lastLearntClause = CRef_Undef;
    conflict_budget = -1;
    propagation_budget = -1;
    nbVarsInitialFormula = INT32_MAX;
    totalTime4Sat = 0.;
    totalTime4Unsat = 0.;
    nbSatCalls = nbUnsatCalls = 0;
    MYFLAG = 0;
    lbdQueue.clear(false);
    lbdQueue.initSize(sizeLBDQueue);
    trailQueue.clear(false);
    trailQueue.initSize(sizeTrailQueue);
    sumLBD = 0;
    nbclausesbeforereduce = firstReduceDB;
    //stats.clear();
    //stats.growTo(coreStatsSize, 0);
    clauses.clear(false);
    learnts.clear(false);
    //permanentLearnts.clear(false);
    //unaryWatchedClauses.clear(false);
    model.clear(false);
    conflict.clear(false);
    activity.clear(false);
    assigns.clear(false);
    polarity.clear(false);
    //forceUNSAT.clear(false);
    decision.clear(false);
    trail.clear(false);
    nbpos.clear(false);
    trail_lim.clear(false);
    vardata.clear(false);
    assumptions.clear(false);
    permDiff.clear(false);
    lastDecisionLevel.clear(false);
    ca.clear();
    seen.clear(false);
    analyze_stack.clear(false);
    analyze_toclear.clear(false);
    add_tmp.clear(false);
    assumptionPositions.clear(false);
    initialPositions.clear(false);
}